

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

bool __thiscall helics::FederateState::getOptionFlag(FederateState *this,int optionFlag)

{
  ushort uVar1;
  bool bVar2;
  uint16_t uVar3;
  uint uVar4;
  ushort *puVar5;
  pointer this_00;
  size_t sVar6;
  int in_ESI;
  long in_RDI;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  undefined8 in_stack_ffffffffffffff80;
  int optionFlag_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  bool local_43;
  
  optionFlag_00 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  if (in_ESI == 0) {
    return (bool)(*(byte *)(in_RDI + 0x33) & 1);
  }
  if (in_ESI == 4) {
    return (bool)(*(byte *)(in_RDI + 0x35) & 1);
  }
  if (in_ESI == 6) {
LAB_004f5705:
    local_43 = (bool)(*(byte *)(in_RDI + 0x31) & 1);
  }
  else {
    if (in_ESI != 8) {
      if (in_ESI == 0x10) {
        return (bool)(*(byte *)(in_RDI + 0x32) & 1);
      }
      if ((in_ESI == 0x1d) || (in_ESI == 0x1f)) {
        return (bool)(*(byte *)(in_RDI + 0x39) & 1);
      }
      if (in_ESI == 0x26) {
        return (bool)(*(byte *)(in_RDI + 0x34) & 1);
      }
      if (in_ESI == 0x43) {
        return (bool)(*(byte *)(in_RDI + 0x29d) & 1);
      }
      if (in_ESI == 0x48) {
        return (bool)(*(byte *)(in_RDI + 0x2fd) & 1);
      }
      if (in_ESI == 0x67) {
        return (bool)(*(byte *)(in_RDI + 0x36) & 1);
      }
      if (in_ESI == 0x114) {
        this_00 = std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
                  operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                              *)0x4f5a1c);
        LogManager::getLogBuffer(this_00);
        sVar6 = LogBuffer::capacity((LogBuffer *)0x4f5a2c);
        return sVar6 != 0;
      }
      if (in_ESI == 0x18d) {
        std::operator&(seq_cst,__memory_order_mask);
        uVar4 = (uint)*(ushort *)(in_RDI + 0x488);
        uVar3 = make_flags(2);
        return (uVar4 & uVar3) != 0;
      }
      if (in_ESI == 0x192) {
        puVar5 = (ushort *)(in_RDI + 0x488);
        std::operator&(seq_cst,__memory_order_mask);
        uVar1 = *puVar5;
        uVar3 = make_flags(8);
        return (uVar1 & uVar3) != 0;
      }
      if (in_ESI == 0x19c) {
        std::operator&(seq_cst,__memory_order_mask);
        uVar1 = *(ushort *)(in_RDI + 0x488);
        uVar3 = make_flags(7);
        return (uVar1 & uVar3) != 0;
      }
      if (in_ESI == 0x19e) {
        return (bool)(*(byte *)(in_RDI + 0x37) & 1);
      }
      if (in_ESI == 0x1bf) {
        return (bool)(*(byte *)(in_RDI + 0x38) & 1);
      }
      if (in_ESI == 0x1c4) goto LAB_004f5705;
      if (in_ESI != 0x1c6) {
        std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
        operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                    *)0x4f5a49);
        bVar2 = TimeCoordinator::getOptionFlag
                          ((TimeCoordinator *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           optionFlag_00);
        return bVar2;
      }
    }
    local_43 = InterfaceInfo::getChangeUpdateFlag((InterfaceInfo *)(in_RDI + 0x40));
  }
  return local_43;
}

Assistant:

bool FederateState::getOptionFlag(int optionFlag) const
{
    switch (optionFlag) {
        case defs::Flags::ONLY_TRANSMIT_ON_CHANGE:
        case defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE:
            return only_transmit_on_change;
        case defs::Flags::ONLY_UPDATE_ON_CHANGE:
        case defs::Options::HANDLE_ONLY_UPDATE_ON_CHANGE:
            return interfaceInformation.getChangeUpdateFlag();
        case defs::Flags::REALTIME:
            return realtime;
        case defs::Flags::OBSERVER:
            return observer;
        case defs::Flags::REENTRANT:
            return reentrant;
        case defs::Flags::CALLBACK_FEDERATE:
            return mCallbackBased;
        case defs::Flags::SOURCE_ONLY:
            return mSourceOnly;
        case defs::Flags::SLOW_RESPONDING:
        case defs::Flags::DEBUGGING:
            return mSlowResponding;
        case defs::Flags::TERMINATE_ON_ERROR:
            return terminate_on_error;
        case defs::Flags::CONNECTIONS_REQUIRED:
            return ((interfaceFlags.load() & make_flags(required_flag)) != 0);
        case defs::Flags::CONNECTIONS_OPTIONAL:
            return ((interfaceFlags.load() & make_flags(optional_flag)) != 0);
        case defs::Options::RECONNECTABLE:
            return ((interfaceFlags.load() & make_flags(reconnectable_flag)) != 0);
        case defs::Flags::STRICT_INPUT_TYPE_CHECKING:
            return strict_input_type_checking;
        case defs::Flags::IGNORE_INPUT_UNIT_MISMATCH:
            return ignore_unit_mismatch;
        case defs::Flags::IGNORE_TIME_MISMATCH_WARNINGS:
            return ignore_time_mismatch_warnings;
        case defs::Properties::LOG_BUFFER:
            return (mLogManager->getLogBuffer().capacity() > 0);
            // NOTE: the allow remote control property is purposely not retrievable and should not
            // be in config generation
        default:
            return timeCoord->getOptionFlag(optionFlag);
    }
}